

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

cTValue * lj_ctype_meta(CTState *cts,CTypeID id,MMS mm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  cTValue *pcVar4;
  
  uVar2 = (ulong)id;
  do {
    uVar3 = uVar2;
    uVar1 = cts->tab[uVar3].info;
    uVar2 = (ulong)(uVar1 & 0xffff);
  } while ((uVar1 & 0xf0800000) == 0x20800000 || uVar1 >> 0x1c == 8);
  if ((uVar1 >> 0x1c == 2) && ((cts->tab[uVar1 & 0xffff].info & 0xf0000000) == 0x60000000)) {
    pcVar4 = lj_tab_getstr(cts->miscmap,&cts->g->strempty);
  }
  else {
    pcVar4 = lj_tab_getinth(cts->miscmap,-(int)uVar3);
  }
  if ((((pcVar4 != (cTValue *)0x0) && ((pcVar4->field_4).it >> 0xf == 0x1fff4)) &&
      (pcVar4 = lj_tab_getstr((GCtab *)((ulong)pcVar4->field_4 & 0x7fffffffffff),
                              (GCstr *)cts->g->gcroot[mm].gcptr64), pcVar4 != (cTValue *)0x0)) &&
     (pcVar4->u64 != 0xffffffffffffffff)) {
    return pcVar4;
  }
  return (cTValue *)0x0;
}

Assistant:

cTValue *lj_ctype_meta(CTState *cts, CTypeID id, MMS mm)
{
  CType *ct = ctype_get(cts, id);
  cTValue *tv;
  while (ctype_isattrib(ct->info) || ctype_isref(ct->info)) {
    id = ctype_cid(ct->info);
    ct = ctype_get(cts, id);
  }
  if (ctype_isptr(ct->info) &&
      ctype_isfunc(ctype_get(cts, ctype_cid(ct->info))->info))
    tv = lj_tab_getstr(cts->miscmap, &cts->g->strempty);
  else
    tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
  if (tv && tvistab(tv) &&
      (tv = lj_tab_getstr(tabV(tv), mmname_str(cts->g, mm))) && !tvisnil(tv))
    return tv;
  return NULL;
}